

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O1

deUint32 tcu::distSquaredToNeighbor<4>
                   (Random *rnd,deUint32 pixel,ConstPixelBufferAccess *surface,int x,int y)

{
  void *pvVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  iVar16 = (surface->m_pitch).m_data[1];
  uVar2 = *(uint *)((long)surface->m_data + (long)(x * 4) + (long)(iVar16 * y));
  uVar14 = pixel & 0xff;
  iVar15 = uVar14 - (uVar2 & 0xff);
  iVar11 = -iVar15;
  if (0 < iVar15) {
    iVar11 = iVar15;
  }
  if (iVar11 < 5) {
    iVar11 = 4;
  }
  uVar6 = pixel >> 8 & 0xff;
  iVar7 = uVar6 - (uVar2 >> 8 & 0xff);
  iVar15 = -iVar7;
  if (0 < iVar7) {
    iVar15 = iVar7;
  }
  if (iVar15 < 5) {
    iVar15 = 4;
  }
  uVar8 = pixel >> 0x10 & 0xff;
  iVar9 = uVar8 - (uVar2 >> 0x10 & 0xff);
  iVar7 = -iVar9;
  if (0 < iVar9) {
    iVar7 = iVar9;
  }
  if (iVar7 < 5) {
    iVar7 = 4;
  }
  uVar13 = pixel >> 0x18;
  iVar10 = uVar13 - (uVar2 >> 0x18);
  iVar9 = -iVar10;
  if (0 < iVar10) {
    iVar9 = iVar10;
  }
  if (iVar9 < 5) {
    iVar9 = 4;
  }
  uVar2 = (iVar9 + -4) * (iVar9 + -4) + (iVar11 + -4) * (iVar11 + -4) +
          (iVar15 + -4) * (iVar15 + -4) + (iVar7 + -4) * (iVar7 + -4);
  if (uVar2 != 0) {
    uVar17 = 0;
    bVar18 = false;
    do {
      iVar11 = distSquaredToNeighbor<4>::s_coords[uVar17][0] + x;
      bVar19 = false;
      if ((((-1 < iVar11) && (iVar11 < (surface->m_size).m_data[0])) &&
          (iVar15 = distSquaredToNeighbor<4>::s_coords[uVar17][1] + y, -1 < iVar15)) &&
         (iVar15 < (surface->m_size).m_data[1])) {
        uVar4 = *(uint *)((long)surface->m_data + (long)(iVar11 * 4) + (long)(iVar15 * iVar16));
        iVar15 = uVar14 - (uVar4 & 0xff);
        iVar11 = -iVar15;
        if (0 < iVar15) {
          iVar11 = iVar15;
        }
        if (iVar11 < 5) {
          iVar11 = 4;
        }
        iVar7 = uVar6 - (uVar4 >> 8 & 0xff);
        iVar15 = -iVar7;
        if (0 < iVar7) {
          iVar15 = iVar7;
        }
        if (iVar15 < 5) {
          iVar15 = 4;
        }
        iVar9 = uVar8 - (uVar4 >> 0x10 & 0xff);
        iVar7 = -iVar9;
        if (0 < iVar9) {
          iVar7 = iVar9;
        }
        if (iVar7 < 5) {
          iVar7 = 4;
        }
        iVar10 = uVar13 - (uVar4 >> 0x18);
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        if (iVar9 < 5) {
          iVar9 = 4;
        }
        uVar4 = (iVar9 + -4) * (iVar9 + -4) + (iVar11 + -4) * (iVar11 + -4) +
                (iVar15 + -4) * (iVar15 + -4) + (iVar7 + -4) * (iVar7 + -4);
        if (uVar4 <= uVar2) {
          uVar2 = uVar4;
        }
        bVar19 = uVar2 == 0;
      }
      if (bVar19) break;
      bVar18 = 6 < uVar17;
      uVar17 = uVar17 + 1;
    } while (uVar17 != 8);
    if (bVar18) {
      iVar16 = 0;
      while( true ) {
        fVar20 = deRandom_getFloat(&rnd->m_rnd);
        fVar21 = deRandom_getFloat(&rnd->m_rnd);
        iVar15 = (surface->m_size).m_data[0];
        iVar7 = (surface->m_size).m_data[1];
        fVar20 = fVar20 + fVar20 + (float)x + -0.5 + -0.5;
        fVar22 = floorf(fVar20);
        iVar12 = (int)fVar22;
        iVar11 = iVar12 + 1;
        fVar21 = fVar21 + fVar21 + (float)y + -0.5 + -0.5;
        fVar23 = floorf(fVar21);
        iVar10 = (int)fVar23;
        iVar15 = iVar15 + -1;
        iVar9 = iVar15;
        if (iVar12 < iVar15) {
          iVar9 = iVar12;
        }
        iVar9 = iVar9 << 2;
        if (iVar11 < iVar15) {
          iVar15 = iVar11;
        }
        iVar15 = iVar15 << 2;
        iVar7 = iVar7 + -1;
        iVar5 = iVar7;
        if (iVar10 < iVar7) {
          iVar5 = iVar10;
        }
        if (iVar10 < 0) {
          iVar5 = 0;
        }
        iVar10 = iVar10 + 1;
        if (iVar10 < iVar7) {
          iVar7 = iVar10;
        }
        if (iVar10 < 0) {
          iVar7 = 0;
        }
        pvVar1 = surface->m_data;
        iVar10 = (surface->m_pitch).m_data[1];
        iVar5 = iVar5 * iVar10;
        if (iVar12 < 0) {
          iVar9 = 0;
        }
        fVar20 = fVar20 - fVar22;
        fVar21 = fVar21 - fVar23;
        if (iVar11 < 0) {
          iVar15 = 0;
        }
        iVar7 = iVar7 * iVar10;
        iVar11 = 0;
        uVar4 = 0;
        do {
          bVar3 = (byte)iVar11;
          iVar10 = (int)((float)(*(uint *)((long)pvVar1 + (long)iVar15 + (long)iVar7) >>
                                 (bVar3 & 0x1f) & 0xff) * fVar20 * fVar21 +
                         (float)(*(uint *)((long)pvVar1 + (long)iVar9 + (long)iVar7) >>
                                 (bVar3 & 0x1f) & 0xff) * (1.0 - fVar20) * fVar21 +
                         (float)(*(uint *)((long)pvVar1 + (long)iVar9 + (long)iVar5) >>
                                 (bVar3 & 0x1f) & 0xff) * (1.0 - fVar20) * (1.0 - fVar21) +
                         (float)(*(uint *)((long)pvVar1 + (long)iVar15 + (long)iVar5) >>
                                 (bVar3 & 0x1f) & 0xff) * fVar20 * (1.0 - fVar21) + 0.5);
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          uVar4 = iVar10 << (bVar3 & 0x1f) | uVar4 & ~(0xff << (bVar3 & 0x1f));
          iVar11 = iVar11 + 8;
        } while (iVar11 != 0x20);
        iVar15 = uVar14 - (uVar4 & 0xff);
        iVar11 = -iVar15;
        if (0 < iVar15) {
          iVar11 = iVar15;
        }
        if (iVar11 < 5) {
          iVar11 = 4;
        }
        iVar7 = uVar6 - (uVar4 >> 8 & 0xff);
        iVar15 = -iVar7;
        if (0 < iVar7) {
          iVar15 = iVar7;
        }
        if (iVar15 < 5) {
          iVar15 = 4;
        }
        iVar9 = uVar8 - (uVar4 >> 0x10 & 0xff);
        iVar7 = -iVar9;
        if (0 < iVar9) {
          iVar7 = iVar9;
        }
        if (iVar7 < 5) {
          iVar7 = 4;
        }
        iVar10 = uVar13 - (uVar4 >> 0x18);
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        if (iVar9 < 5) {
          iVar9 = 4;
        }
        uVar4 = (iVar9 + -4) * (iVar9 + -4) + (iVar11 + -4) * (iVar11 + -4) +
                (iVar15 + -4) * (iVar15 + -4) + (iVar7 + -4) * (iVar7 + -4);
        if (uVar2 < uVar4) {
          uVar4 = uVar2;
        }
        uVar2 = uVar4;
        if (uVar2 == 0) break;
        iVar16 = iVar16 + 1;
        if (iVar16 == 0x20) {
          return uVar2;
        }
      }
    }
  }
  return 0;
}

Assistant:

static deUint32 distSquaredToNeighbor (de::Random& rnd, deUint32 pixel, const ConstPixelBufferAccess& surface, int x, int y)
{
	// (x, y) + (0, 0)
	deUint32	minDist		= colorDistSquared(pixel, readUnorm8<NumChannels>(surface, x, y));

	if (minDist == 0)
		return minDist;

	// Area around (x, y)
	static const int s_coords[][2] =
	{
		{-1, -1},
		{ 0, -1},
		{+1, -1},
		{-1,  0},
		{+1,  0},
		{-1, +1},
		{ 0, +1},
		{+1, +1}
	};

	for (int d = 0; d < (int)DE_LENGTH_OF_ARRAY(s_coords); d++)
	{
		int dx = x + s_coords[d][0];
		int dy = y + s_coords[d][1];

		if (!deInBounds32(dx, 0, surface.getWidth()) || !deInBounds32(dy, 0, surface.getHeight()))
			continue;

		minDist = de::min(minDist, colorDistSquared(pixel, readUnorm8<NumChannels>(surface, dx, dy)));
		if (minDist == 0)
			return minDist;
	}

	// Random bilinear-interpolated samples around (x, y)
	for (int s = 0; s < 32; s++)
	{
		float dx = (float)x + rnd.getFloat()*2.0f - 0.5f;
		float dy = (float)y + rnd.getFloat()*2.0f - 0.5f;

		deUint32 sample = bilinearSample<NumChannels>(surface, dx, dy);

		minDist = de::min(minDist, colorDistSquared(pixel, sample));
		if (minDist == 0)
			return minDist;
	}

	return minDist;
}